

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

HTS_Boolean HTS_match_head_string(char *str,char *pattern,size_t *matched_size)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar3 = 0;
  do {
    *matched_size = sVar3;
    pcVar1 = pattern + sVar3;
    if (*pcVar1 == '\0') {
      return '\x01';
    }
    pcVar2 = str + sVar3;
    sVar3 = sVar3 + 1;
  } while (*pcVar2 == *pcVar1);
  return '\0';
}

Assistant:

static HTS_Boolean HTS_match_head_string(const char *str, const char *pattern, size_t * matched_size)
{

   (*matched_size) = 0;
   while (1) {
      if (pattern[(*matched_size)] == '\0')
         return TRUE;
      if (str[(*matched_size)] == '\0')
         return FALSE;
      if (str[(*matched_size)] != pattern[(*matched_size)])
         return FALSE;
      (*matched_size)++;
   }
}